

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O0

size_t __thiscall
helix::nasdaq::nordic_itch_handler::process_packet(nordic_itch_handler *this,packet_view *packet)

{
  itch_message *piVar1;
  packet_view *in_RSI;
  nordic_itch_handler *in_RDI;
  itch_message *msg;
  packet_view *in_stack_ffffffffffffffc8;
  size_t local_8;
  
  piVar1 = net::packet_view::cast<itch_message>(in_RSI);
  switch(piVar1->MsgType) {
  case 'A':
    local_8 = process_msg<itch_add_order>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 'B':
    local_8 = process_msg<itch_broken_trade>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 'C':
    local_8 = process_msg<itch_order_executed_with_price>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 'D':
    local_8 = process_msg<itch_order_delete>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 'E':
    local_8 = process_msg<itch_order_executed>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 'F':
    local_8 = process_msg<itch_add_order_mpid>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  default:
    local_8 = 0;
    break;
  case 'H':
    local_8 = process_msg<itch_order_book_trading_action>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 'I':
    local_8 = process_msg<itch_noii>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 'M':
    local_8 = process_msg<itch_milliseconds>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 'O':
    local_8 = process_msg<itch_market_segment_state>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 'P':
    local_8 = process_msg<itch_trade>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 'Q':
    local_8 = process_msg<itch_cross_trade>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 'R':
    local_8 = process_msg<itch_order_book_directory>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 'S':
    local_8 = process_msg<itch_system_event>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 'T':
    local_8 = process_msg<itch_seconds>(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 'X':
    local_8 = process_msg<itch_order_cancel>(in_RDI,in_stack_ffffffffffffffc8);
  }
  return local_8;
}

Assistant:

size_t nordic_itch_handler::process_packet(const net::packet_view& packet)
{
    auto* msg = packet.cast<itch_message>();
    switch (msg->MsgType) {
    case 'T': return process_msg<itch_seconds>(packet);
    case 'M': return process_msg<itch_milliseconds>(packet);
    case 'O': return process_msg<itch_market_segment_state>(packet);
    case 'S': return process_msg<itch_system_event>(packet);
    case 'R': return process_msg<itch_order_book_directory>(packet);
    case 'H': return process_msg<itch_order_book_trading_action>(packet);
    case 'A': return process_msg<itch_add_order>(packet);
    case 'F': return process_msg<itch_add_order_mpid>(packet);
    case 'E': return process_msg<itch_order_executed>(packet);
    case 'C': return process_msg<itch_order_executed_with_price>(packet);
    case 'X': return process_msg<itch_order_cancel>(packet);
    case 'D': return process_msg<itch_order_delete>(packet);
    case 'P': return process_msg<itch_trade>(packet);
    case 'Q': return process_msg<itch_cross_trade>(packet);
    case 'B': return process_msg<itch_broken_trade>(packet);
    case 'I': return process_msg<itch_noii>(packet);
    default:  return 0;
    }
}